

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  json_str jsonStr;
  allocator<char> local_70 [32];
  string local_50;
  json_str local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"hello",local_70);
  json_str::json_str(&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)local_70,&local_30.value);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)local_70);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)local_70);
  json_str::~json_str(&local_30);
  return 0;
}

Assistant:

int main() {
    json_str jsonStr = str_value_of("hello");
    cout << jsonStr.str_value() << endl;
    return 0;
}